

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsLayoutPrivate::QGraphicsLayoutPrivate(&this->super_QGraphicsLayoutPrivate);
  (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
  _vptr_QGraphicsLayoutItemPrivate = (_func_int **)&PTR__QGraphicsAnchorLayoutPrivate_007eb188;
  (this->spacings).m_data[0] = -1.0;
  (this->spacings).m_data[1] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[2] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[0] = -1.0;
  (this->sizeHints).m_data[0]._M_elems[1] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[2] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[0] = -1.0;
  (this->sizeHints).m_data[1]._M_elems[1] = -1.0;
  memset(&this->items,0,0x140);
  (this->interpolationProgress).m_data[0] = -1.0;
  (this->interpolationProgress).m_data[1] = -1.0;
  *(undefined2 *)(this->graphHasConflicts).m_data = 0;
  (this->m_floatItems).m_data[0].q_hash.d = (Data *)0x0;
  (this->m_floatItems).m_data[1].q_hash.d = (Data *)0x0;
  this->field_0x2c0 = this->field_0x2c0 | 3;
  QLayoutStyleInfo::QLayoutStyleInfo(&this->cachedStyleInfo);
  return;
}

Assistant:

QGraphicsAnchorLayoutPrivate::QGraphicsAnchorLayoutPrivate()
    : calculateGraphCacheDirty(true), styleInfoDirty(true)
{
}